

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  abctime aVar2;
  int *__ptr;
  abctime aVar3;
  char *pcVar4;
  int *pSimInfo;
  abctime clk;
  uint local_40;
  int nInsLimit;
  int nConfLimit;
  int fVerbose;
  int RetValue;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nInsLimit = 0;
  local_40 = 0;
  clk._4_4_ = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"CIvh");
      if (iVar1 == -1) {
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkLatchNum(pNtk_00);
        if (0 < iVar1) {
          Abc_Print(-1,"Currently can only solve the miter for combinational circuits.\n");
          return 0;
        }
        aVar2 = Abc_Clock();
        iVar1 = Abc_NtkIsStrash(pNtk_00);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkIsLogic(pNtk_00);
          if (iVar1 == 0) {
            __assert_fail("Abc_NtkIsLogic(pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abc.c"
                          ,0x60c6,"int Abc_CommandSat(Abc_Frame_t *, int, char **)");
          }
          Abc_NtkToBdd(pNtk_00);
          nConfLimit = Abc_NtkMiterSat(pNtk_00,(long)(int)local_40,(long)(int)clk._4_4_,nInsLimit,
                                       (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        }
        else {
          nConfLimit = Abc_NtkMiterSat(pNtk_00,(long)(int)local_40,(long)(int)clk._4_4_,nInsLimit,
                                       (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        }
        if ((nConfLimit == 0) && (iVar1 = Abc_NtkPoNum(pNtk_00), iVar1 == 1)) {
          __ptr = Abc_NtkVerifySimulatePattern(pNtk_00,pNtk_00->pModel);
          if (*__ptr != 1) {
            Abc_Print(1,"ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n");
          }
          if (__ptr != (int *)0x0) {
            free(__ptr);
          }
        }
        pAbc->Status = nConfLimit;
        if (nConfLimit == -1) {
          Abc_Print(1,"UNDECIDED      ");
        }
        else if (nConfLimit == 0) {
          Abc_Print(1,"SATISFIABLE    ");
        }
        else {
          Abc_Print(1,"UNSATISFIABLE  ");
        }
        aVar3 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar3 - aVar2);
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x49) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
          goto LAB_00287c5a;
        }
        clk._4_4_ = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if ((int)clk._4_4_ < 0) goto LAB_00287c5a;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_00287c5a;
        nInsLimit = nInsLimit ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_40);
LAB_00287c5a:
  Abc_Print(-2,"usage: sat [-C num] [-I num] [-vh]\n");
  Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
  Abc_Print(-2,"\t         derives CNF from the current network and leave it unchanged\n");
  Abc_Print(-2,"\t         (there is also a newer SAT solving command \"dsat\")\n");
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_40);
  Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",(ulong)clk._4_4_);
  pcVar4 = "no";
  if (nInsLimit != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int RetValue;
    int fVerbose;
    int nConfLimit;
    int nInsLimit;
    abctime clk;
    // set defaults
    fVerbose   = 0;
    nConfLimit = 0;
    nInsLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CIvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }

    clk = Abc_Clock();
    if ( Abc_NtkIsStrash(pNtk) )
    {
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, fVerbose, NULL, NULL );
    }
    else
    {
        assert( Abc_NtkIsLogic(pNtk) );
        Abc_NtkToBdd( pNtk );
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, fVerbose, NULL, NULL );
    }

    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        //int i;
        //Abc_Obj_t * pObj;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        /*
        // print model
        Abc_NtkForEachPi( pNtk, pObj, i )
        {
            Abc_Print( -1, "%d", (int)(pNtk->pModel[i] > 0) );
            if ( i == 70 )
                break;
        }
        Abc_Print( -1, "\n" );
        */
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;

usage:
    Abc_Print( -2, "usage: sat [-C num] [-I num] [-vh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leave it unchanged\n" );
    Abc_Print( -2, "\t         (there is also a newer SAT solving command \"dsat\")\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}